

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdGetTxIn(void *handle,int net_type,char *tx_hex_string,uint32_t index,char **txid,
              uint32_t *vout,uint32_t *sequence,char **script_sig)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  CfdException *this;
  bool is_bitcoin;
  char *work_txid;
  Script local_2e0;
  undefined8 local_2a8;
  Txid temp_txid;
  Script temp_unlocking_script;
  TxInReference ref;
  TransactionContext tx;
  
  work_txid = (char *)0x0;
  local_2a8 = 0;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (!bVar1) {
    is_bitcoin = false;
    cfd::capi::ConvertNetType(net_type,&is_bitcoin);
    cfd::core::Txid::Txid(&temp_txid);
    cfd::core::Script::Script(&temp_unlocking_script);
    if (is_bitcoin == true) {
      std::__cxx11::string::string((string *)&ref,tx_hex_string,(allocator *)&local_2e0);
      cfd::TransactionContext::TransactionContext(&tx,(string *)&ref);
      std::__cxx11::string::~string((string *)&ref);
      cfd::core::Transaction::GetTxIn(&ref,&tx.super_Transaction,index);
      cfd::core::Txid::Txid((Txid *)&local_2e0,&ref.super_AbstractTxInReference.txid_);
      cfd::core::Txid::operator=(&temp_txid,(Txid *)&local_2e0);
      cfd::core::Txid::~Txid((Txid *)&local_2e0);
      cfd::core::Script::Script(&local_2e0,&ref.super_AbstractTxInReference.unlocking_script_);
      cfd::core::Script::operator=(&temp_unlocking_script,&local_2e0);
      cfd::core::Script::~Script(&local_2e0);
      if (vout != (uint32_t *)0x0) {
        *vout = ref.super_AbstractTxInReference.vout_;
      }
      if (sequence != (uint32_t *)0x0) {
        *sequence = ref.super_AbstractTxInReference.sequence_;
      }
      cfd::core::AbstractTxInReference::~AbstractTxInReference(&ref.super_AbstractTxInReference);
      cfd::TransactionContext::~TransactionContext(&tx);
    }
    else {
      std::__cxx11::string::string((string *)&tx,tx_hex_string,(allocator *)&local_2e0);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)&ref,(string *)&tx);
      std::__cxx11::string::~string((string *)&tx);
      cfd::core::ConfidentialTransaction::GetTxIn
                ((ConfidentialTxInReference *)&tx,(ConfidentialTransaction *)&ref,index);
      cfd::core::Txid::Txid
                ((Txid *)&local_2e0,
                 (Txid *)&tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_);
      cfd::core::Txid::operator=(&temp_txid,(Txid *)&local_2e0);
      cfd::core::Txid::~Txid((Txid *)&local_2e0);
      cfd::core::Script::Script
                (&local_2e0,
                 (Script *)
                 &tx.super_Transaction.vout_.
                  super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      cfd::core::Script::operator=(&temp_unlocking_script,&local_2e0);
      cfd::core::Script::~Script(&local_2e0);
      if (vout != (uint32_t *)0x0) {
        *vout = (uint32_t)
                tx.super_Transaction.vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_start;
      }
      if (sequence != (uint32_t *)0x0) {
        *sequence = (uint32_t)tx.signed_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      }
      cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
                ((ConfidentialTxInReference *)&tx);
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)&ref);
    }
    if (txid == (char **)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      cfd::core::Txid::GetHex_abi_cxx11_((string *)&tx,&temp_txid);
      pcVar2 = cfd::capi::CreateString((string *)&tx);
      work_txid = pcVar2;
      std::__cxx11::string::~string((string *)&tx);
    }
    if (script_sig == (char **)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      cfd::core::Script::GetHex_abi_cxx11_((string *)&tx,&temp_unlocking_script);
      pcVar3 = cfd::capi::CreateString((string *)&tx);
      std::__cxx11::string::~string((string *)&tx);
    }
    if (pcVar2 != (char *)0x0) {
      *txid = pcVar2;
    }
    if (pcVar3 != (char *)0x0) {
      *script_sig = pcVar3;
    }
    cfd::core::Script::~Script(&temp_unlocking_script);
    cfd::core::Txid::~Txid(&temp_txid);
    return 0;
  }
  tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x4fe2f6;
  tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x9b7;
  tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_7f7ec3;
  cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"tx is null or empty.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&tx,"Failed to parameter. tx is null or empty.",(allocator *)&ref);
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&tx);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxIn(
    void* handle, int net_type, const char* tx_hex_string, uint32_t index,
    char** txid, uint32_t* vout, uint32_t* sequence, char** script_sig) {
  char* work_txid = nullptr;
  char* work_script_sig = nullptr;
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    Txid temp_txid;
    Script temp_unlocking_script;
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      const TxInReference ref = tx.GetTxIn(index);
      temp_txid = ref.GetTxid();
      temp_unlocking_script = ref.GetUnlockingScript();
      if (vout != nullptr) *vout = ref.GetVout();
      if (sequence != nullptr) *sequence = ref.GetSequence();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      const ConfidentialTxInReference ref = tx.GetTxIn(index);
      temp_txid = ref.GetTxid();
      temp_unlocking_script = ref.GetUnlockingScript();
      if (vout != nullptr) *vout = ref.GetVout();
      if (sequence != nullptr) *sequence = ref.GetSequence();
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if (txid != nullptr) {
      work_txid = CreateString(temp_txid.GetHex());
    }
    if (script_sig != nullptr) {
      work_script_sig = CreateString(temp_unlocking_script.GetHex());
    }

    if (work_txid != nullptr) *txid = work_txid;
    if (work_script_sig != nullptr) *script_sig = work_script_sig;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_txid, &work_script_sig);
  return result;
}